

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ValueBytes(sqlite3_value *pVal,u8 enc)

{
  Mem *p;
  u8 enc_local;
  sqlite3_value *pVal_local;
  
  if (((pVal->flags & 2) == 0) || (pVal->enc != enc)) {
    if ((pVal->flags & 0x10) == 0) {
      if ((pVal->flags & 1) == 0) {
        pVal_local._4_4_ = valueBytes(pVal,enc);
      }
      else {
        pVal_local._4_4_ = 0;
      }
    }
    else if ((pVal->flags & 0x4000) == 0) {
      pVal_local._4_4_ = pVal->n;
    }
    else {
      pVal_local._4_4_ = pVal->n + (pVal->u).nZero;
    }
  }
  else {
    pVal_local._4_4_ = pVal->n;
  }
  return pVal_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ValueBytes(sqlite3_value *pVal, u8 enc){
  Mem *p = (Mem*)pVal;
  assert( (p->flags & MEM_Null)==0 || (p->flags & (MEM_Str|MEM_Blob))==0 );
  if( (p->flags & MEM_Str)!=0 && pVal->enc==enc ){
    return p->n;
  }
  if( (p->flags & MEM_Blob)!=0 ){
    if( p->flags & MEM_Zero ){
      return p->n + p->u.nZero;
    }else{
      return p->n;
    }
  }
  if( p->flags & MEM_Null ) return 0;
  return valueBytes(pVal, enc);
}